

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool.cpp
# Opt level: O2

MppMemPoolImpl * __thiscall
MppMemPoolService::get_pool(MppMemPoolService *this,char *caller,size_t size)

{
  list_head *plVar1;
  MppMemPoolImpl *pMVar2;
  list_head *plVar3;
  pthread_mutexattr_t attr;
  AutoMutex auto_lock;
  
  pMVar2 = (MppMemPoolImpl *)mpp_osal_malloc("get_pool",0x80);
  if (pMVar2 != (MppMemPoolImpl *)0x0) {
    pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
    pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
    pthread_mutex_init((pthread_mutex_t *)&pMVar2->lock,(pthread_mutexattr_t *)&attr);
    pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
    pMVar2->check = pMVar2;
    pMVar2->caller = caller;
    pMVar2->size = size;
    pMVar2->used_count = 0;
    pMVar2->unused_count = 0;
    pMVar2->finalized = 0;
    (pMVar2->used).next = &pMVar2->used;
    (pMVar2->used).prev = &pMVar2->used;
    (pMVar2->unused).next = &pMVar2->unused;
    (pMVar2->unused).prev = &pMVar2->unused;
    plVar3 = &pMVar2->service_link;
    (pMVar2->service_link).next = plVar3;
    (pMVar2->service_link).prev = plVar3;
    auto_lock.mLock = get_lock();
    auto_lock.mEnabled = 1;
    if ((pthread_mutex_t *)auto_lock.mLock != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock((pthread_mutex_t *)auto_lock.mLock);
    }
    plVar1 = (this->mLink).prev;
    (this->mLink).prev = plVar3;
    (pMVar2->service_link).next = &this->mLink;
    (pMVar2->service_link).prev = plVar1;
    plVar1->next = plVar3;
    Mutex::Autolock::~Autolock(&auto_lock);
  }
  return pMVar2;
}

Assistant:

MppMemPoolImpl *MppMemPoolService::get_pool(const char *caller, size_t size)
{
    MppMemPoolImpl *pool = mpp_malloc(MppMemPoolImpl, 1);
    if (NULL == pool)
        return NULL;

    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&pool->lock, &attr);
    pthread_mutexattr_destroy(&attr);

    pool->check = pool;
    pool->caller = caller;
    pool->size = size;
    pool->used_count = 0;
    pool->unused_count = 0;
    pool->finalized = 0;

    INIT_LIST_HEAD(&pool->used);
    INIT_LIST_HEAD(&pool->unused);
    INIT_LIST_HEAD(&pool->service_link);
    AutoMutex auto_lock(get_lock());
    list_add_tail(&pool->service_link, &mLink);

    return pool;
}